

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O1

void MapOptHandler_cluster(FMapInfoParser *parse,level_info_t *info)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  cluster_info_t *pcVar4;
  
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,"=");
  }
  FScanner::MustGetNumber(&parse->sc);
  iVar1 = (parse->sc).Number;
  info->cluster = iVar1;
  if ((ulong)wadclusterinfos.Count != 0) {
    uVar3 = 0;
    pcVar4 = wadclusterinfos.Array;
    do {
      if (pcVar4->cluster == iVar1) goto LAB_004b5feb;
      uVar3 = uVar3 + 1;
      pcVar4 = pcVar4 + 1;
    } while (wadclusterinfos.Count != uVar3);
    uVar3 = 0xffffffff;
LAB_004b5feb:
    if ((int)uVar3 != -1) {
      return;
    }
  }
  uVar2 = TArray<cluster_info_t,_cluster_info_t>::Reserve(&wadclusterinfos,1);
  pcVar4 = wadclusterinfos.Array + uVar2;
  cluster_info_t::Reset(pcVar4);
  pcVar4->cluster = (parse->sc).Number;
  if (parse->HexenHack == true) {
    *(byte *)&pcVar4->flags = (byte)pcVar4->flags | 1;
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(cluster, true)
{
	parse.ParseAssign();
	parse.sc.MustGetNumber();
	info->cluster = parse.sc.Number;

	// If this cluster hasn't been defined yet, add it. This is especially needed
	// for Hexen, because it doesn't have clusterdefs. If we don't do this, every
	// level on Hexen will sometimes be considered as being on the same hub,
	// depending on the check done.
	if (FindWadClusterInfo (parse.sc.Number) == -1)
	{
		unsigned int clusterindex = wadclusterinfos.Reserve(1);
		cluster_info_t *clusterinfo = &wadclusterinfos[clusterindex];
		clusterinfo->Reset();
		clusterinfo->cluster = parse.sc.Number;
		if (parse.HexenHack)
		{
			clusterinfo->flags |= CLUSTER_HUB;
		}
	}
}